

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O3

int __thiscall sf::WindowBase::close(WindowBase *this,int __fd)

{
  int in_EAX;
  
  if (this->m_impl != (WindowImpl *)0x0) {
    in_EAX = (*this->m_impl->_vptr_WindowImpl[1])();
  }
  this->m_impl = (WindowImpl *)0x0;
  if ((anonymous_namespace)::WindowsBaseImpl::fullscreenWindow == this) {
    (anonymous_namespace)::WindowsBaseImpl::fullscreenWindow = (WindowBase *)0x0;
  }
  return in_EAX;
}

Assistant:

void WindowBase::close()
{
    // Delete the window implementation
    delete m_impl;
    m_impl = NULL;

    // Update the fullscreen window
    if (this == getFullscreenWindow())
        setFullscreenWindow(NULL);
}